

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImVector<ImDrawVert> * __thiscall
ImVector<ImDrawVert>::operator=(ImVector<ImDrawVert> *this,ImVector<ImDrawVert> *src)

{
  int iVar1;
  int iVar2;
  ImDrawVert *__dest;
  int iVar3;
  
  if (this->Data != (ImDrawVert *)0x0) {
    this->Size = 0;
    this->Capacity = 0;
    ImGui::MemFree(this->Data);
    this->Data = (ImDrawVert *)0x0;
  }
  iVar1 = src->Size;
  iVar2 = this->Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    if (iVar3 <= iVar1) {
      iVar3 = iVar1;
    }
    if (iVar2 < iVar3) {
      __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar3 * 0x14);
      if (this->Data != (ImDrawVert *)0x0) {
        memcpy(__dest,this->Data,(long)this->Size * 0x14);
        ImGui::MemFree(this->Data);
      }
      this->Data = __dest;
      this->Capacity = iVar3;
    }
  }
  this->Size = iVar1;
  if (src->Data != (ImDrawVert *)0x0) {
    memcpy(this->Data,src->Data,(long)iVar1 * 0x14);
  }
  return this;
}

Assistant:

inline ImVector<T>& operator=(const ImVector<T>& src)   { clear(); resize(src.Size); if (src.Data) memcpy(Data, src.Data, (size_t)Size * sizeof(T)); return *this; }